

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O0

void __thiscall xmrig::App::App(App *this,Process *process)

{
  Miner *pMVar1;
  Controller *in_RDI;
  Process *in_stack_ffffffffffffffc8;
  
  IConsoleListener::IConsoleListener((IConsoleListener *)in_RDI);
  ISignalListener::ISignalListener((ISignalListener *)&(in_RDI->super_Base).super_IApiListener);
  (in_RDI->super_Base).super_IWatcherListener._vptr_IWatcherListener =
       (_func_int **)&PTR__App_002b8558;
  (in_RDI->super_Base).super_IApiListener._vptr_IApiListener = (_func_int **)&PTR__App_002b8588;
  (in_RDI->super_Base).d_ptr = (BasePrivate *)0x0;
  in_RDI->m_miner = (Miner *)0x0;
  in_RDI->m_network = (Network *)0x0;
  pMVar1 = (Miner *)operator_new(0x28);
  Controller::Controller(in_RDI,in_stack_ffffffffffffffc8);
  in_RDI->m_miner = pMVar1;
  return;
}

Assistant:

xmrig::App::App(Process *process)
{
    m_controller = new Controller(process);
}